

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Framebuffer.cpp
# Opt level: O0

Ptr<Framebuffer> myvk::Framebuffer::Create(Ptr<RenderPass> *render_pass,Ptr<ImageView> *image_view)

{
  initializer_list<std::shared_ptr<myvk::ImageView>_> __l;
  element_type *this;
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Ptr<Framebuffer> PVar1;
  uint32_t in_stack_00000044;
  VkExtent2D *in_stack_00000048;
  vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  *in_stack_00000050;
  Ptr<RenderPass> *in_stack_00000058;
  shared_ptr<myvk::ImageView> *in_stack_ffffffffffffff28;
  shared_ptr<myvk::ImageView> *in_stack_ffffffffffffff30;
  vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  *in_stack_ffffffffffffff40;
  undefined1 **local_b0;
  allocator_type *in_stack_ffffffffffffff58;
  vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  *in_stack_ffffffffffffff60;
  element_type *peVar2;
  allocator<std::shared_ptr<myvk::ImageView>_> local_51;
  undefined1 *local_50 [2];
  undefined8 *local_40;
  undefined8 local_38;
  
  peVar2 = in_RDI;
  std::shared_ptr<myvk::ImageView>::shared_ptr(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_38 = 1;
  local_40 = local_50;
  std::allocator<std::shared_ptr<myvk::ImageView>_>::allocator
            ((allocator<std::shared_ptr<myvk::ImageView>_> *)0x2e25de);
  __l._M_len = (size_type)peVar2;
  __l._M_array = (iterator)in_RDI;
  std::vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  ::vector(in_stack_ffffffffffffff60,__l,in_stack_ffffffffffffff58);
  this = std::__shared_ptr_access<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x2e260f);
  ImageView::GetImagePtr(this);
  this_00 = std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2e2628);
  ImageBase::GetExtent2D(this_00);
  Create(in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000044);
  std::vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  ::~vector(in_stack_ffffffffffffff40);
  std::allocator<std::shared_ptr<myvk::ImageView>_>::~allocator(&local_51);
  local_b0 = (undefined1 **)&local_40;
  do {
    local_b0 = local_b0 + -2;
    std::shared_ptr<myvk::ImageView>::~shared_ptr((shared_ptr<myvk::ImageView> *)0x2e26a8);
  } while (local_b0 != local_50);
  PVar1.super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  return (Ptr<Framebuffer>)PVar1.super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Framebuffer> Framebuffer::Create(const Ptr<RenderPass> &render_pass, const Ptr<ImageView> &image_view) {
	return Create(render_pass, {image_view}, image_view->GetImagePtr()->GetExtent2D(), 1);
}